

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dino.c
# Opt level: O0

void response_header_set(DHANDLE dhandle,char *key,char *value)

{
  dino_http_response_t *pdVar1;
  dino_http_response_t *response;
  char *value_local;
  char *key_local;
  DHANDLE dhandle_local;
  
  pdVar1 = cast_dhandle_response(dhandle);
  if (pdVar1 == (dino_http_response_t *)0x0) {
    log_message(3,"response_header_set",
                "/workspace/llm4binary/github/license_all_cmakelists_25/henryse[P]dino-web-framework/lib/dino.c"
                ,0x189,"Response is NULL...");
  }
  else if ((key == (char *)0x0) || (*key == '\0')) {
    log_message(3,"response_header_set",
                "/workspace/llm4binary/github/license_all_cmakelists_25/henryse[P]dino-web-framework/lib/dino.c"
                ,0x186,"Invalid key, must have at least one character...");
  }
  else {
    dino_strmap_add(pdVar1->params_map,key,value);
  }
  return;
}

Assistant:

void DINO_EXPORT response_header_set(DHANDLE dhandle, const char *key, const char *value) {
    dino_http_response_t *response = cast_dhandle_response(dhandle);

    if (NULL != response) {
        if (key && *key) {
            dino_strmap_add(response->params_map, key, value);
        } else {
            log_message(LOG_ERR, __FUNCTION__, __FILE__, __LINE__, "Invalid key, must have at least one character...");
        }
    } else {
        log_message(LOG_ERR, __FUNCTION__, __FILE__, __LINE__, "Response is NULL...");
    }
}